

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O1

void CalculatePercentilesByWeight
               (CAmount *result,
               vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *scores,
               int64_t total_weight)

{
  pointer ppVar1;
  ulong uVar2;
  int64_t i;
  long lVar3;
  pointer ppVar4;
  long lVar5;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *__range1;
  long in_FS_OFFSET;
  double dVar6;
  double local_58 [5];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  ppVar4 = (scores->
           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (scores->
           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != ppVar1) {
    uVar2 = (long)ppVar1 - (long)ppVar4 >> 4;
    lVar3 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<long,long>*,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar4,ppVar1,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long,long>*,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar4);
    dVar6 = (double)total_weight;
    local_58[0] = dVar6 / 10.0;
    local_58[1] = dVar6 * 0.25;
    local_58[2] = dVar6 * 0.5;
    local_58[3] = dVar6 * 3.0 * 0.25;
    local_58[4] = (dVar6 * 9.0) / 10.0;
    ppVar4 = (scores->
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (scores->
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    lVar3 = 0;
    if (ppVar4 != ppVar1) {
      lVar5 = 0;
      do {
        lVar5 = lVar5 + ppVar4->second;
        if (lVar3 < 5) {
          do {
            if ((double)lVar5 < local_58[lVar3]) goto LAB_002a1870;
            result[lVar3] = ppVar4->first;
            lVar3 = lVar3 + 1;
          } while (lVar3 != 5);
          lVar3 = 5;
        }
LAB_002a1870:
        ppVar4 = ppVar4 + 1;
      } while (ppVar4 != ppVar1);
    }
    if (lVar3 < 5) {
      do {
        result[lVar3] = ppVar1[-1].first;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 5);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CalculatePercentilesByWeight(CAmount result[NUM_GETBLOCKSTATS_PERCENTILES], std::vector<std::pair<CAmount, int64_t>>& scores, int64_t total_weight)
{
    if (scores.empty()) {
        return;
    }

    std::sort(scores.begin(), scores.end());

    // 10th, 25th, 50th, 75th, and 90th percentile weight units.
    const double weights[NUM_GETBLOCKSTATS_PERCENTILES] = {
        total_weight / 10.0, total_weight / 4.0, total_weight / 2.0, (total_weight * 3.0) / 4.0, (total_weight * 9.0) / 10.0
    };

    int64_t next_percentile_index = 0;
    int64_t cumulative_weight = 0;
    for (const auto& element : scores) {
        cumulative_weight += element.second;
        while (next_percentile_index < NUM_GETBLOCKSTATS_PERCENTILES && cumulative_weight >= weights[next_percentile_index]) {
            result[next_percentile_index] = element.first;
            ++next_percentile_index;
        }
    }

    // Fill any remaining percentiles with the last value.
    for (int64_t i = next_percentile_index; i < NUM_GETBLOCKSTATS_PERCENTILES; i++) {
        result[i] = scores.back().first;
    }
}